

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMapNoLock(MapFieldBase *this)

{
  Arena *this_00;
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  
  if (this->repeated_field_ != (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    return;
  }
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    pRVar1 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
    (pRVar1->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
    (pRVar1->super_RepeatedPtrFieldBase).current_size_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).total_size_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation
                (this_00,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,0x18);
    }
    pRVar1 = (RepeatedPtrField<google::protobuf::Message> *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (&this_00->impl_,0x18,
                        arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                       );
    (pRVar1->super_RepeatedPtrFieldBase).arena_ = this_00;
    (pRVar1->super_RepeatedPtrFieldBase).current_size_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).total_size_ = 0;
    (pRVar1->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
  }
  this->repeated_field_ = pRVar1;
  return;
}

Assistant:

void MapFieldBase::SyncRepeatedFieldWithMapNoLock() const {
  if (repeated_field_ == NULL) {
    repeated_field_ = Arena::CreateMessage<RepeatedPtrField<Message> >(arena_);
  }
}